

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6aa98::DepsLogTestTruncatedRecovery::Run(DepsLogTestTruncatedRecovery *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  LoadStatus LVar6;
  Node *pNVar7;
  Deps *pDVar8;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  StringPiece path_05;
  StringPiece path_06;
  StringPiece path_07;
  StringPiece path_08;
  StringPiece path_09;
  Node *local_1e0;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string err;
  DepsLog log;
  State state;
  
  State::State(&state);
  pTVar3 = g_current_test;
  paVar1 = &log.file_path_.field_2;
  log._0_8_ = log._0_8_ & 0xffffffffffffff00;
  log.file_ = (FILE *)0x0;
  log.file_path_._M_string_length = 0;
  log.file_path_.field_2._M_local_buf[0] = '\0';
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  paVar2 = &err.field_2;
  err._M_string_length = 0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)paVar2;
  log.file_path_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deps,"DepsLogTest-tempfile",(allocator<char> *)&local_1e0);
  bVar4 = DepsLog::OpenForWrite(&log,(string *)&deps,&err);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x1a3,"log.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&deps);
  pTVar3 = g_current_test;
  bVar4 = std::operator==("",&err);
  bVar4 = testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x1a4,"\"\" == err");
  if (bVar4) {
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    path.len_ = 5;
    path.str_ = "foo.h";
    local_1e0 = State::GetNode(&state,path,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,&local_1e0);
    path_00.len_ = 5;
    path_00.str_ = "bar.h";
    local_1e0 = State::GetNode(&state,path_00,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,&local_1e0);
    path_01.len_ = 5;
    path_01.str_ = "out.o";
    pNVar7 = State::GetNode(&state,path_01,0);
    DepsLog::RecordDeps(&log,pNVar7,1,&deps);
    if (deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    path_02.len_ = 5;
    path_02.str_ = "foo.h";
    local_1e0 = State::GetNode(&state,path_02,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,&local_1e0);
    path_03.len_ = 6;
    path_03.str_ = "bar2.h";
    local_1e0 = State::GetNode(&state,path_03,0);
    std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
              ((vector<Node*,std::allocator<Node*>> *)&deps,&local_1e0);
    path_04.len_ = 6;
    path_04.str_ = "out2.o";
    pNVar7 = State::GetNode(&state,path_04,0);
    DepsLog::RecordDeps(&log,pNVar7,2,&deps);
    DepsLog::Close(&log);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog(&log);
  State::~State(&state);
  pTVar3 = g_current_test;
  if (!bVar4) {
    return;
  }
  iVar5 = stat("DepsLogTest-tempfile",(stat *)&state);
  bVar4 = testing::Test::Check
                    (pTVar3,iVar5 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x1b6,"0 == stat(kTestFilename, &st)");
  pTVar3 = g_current_test;
  if (!bVar4) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  log._0_8_ = &log.file_path_;
  log.file_ = (FILE *)0x0;
  log.file_path_._M_dataplus._M_p = log.file_path_._M_dataplus._M_p & 0xffffffffffffff00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"DepsLogTest-tempfile",(allocator<char> *)&deps);
  bVar4 = Truncate(&err,(size_t)((long)&state.paths_._M_h._M_single_bucket[-1]._M_nxt + 6),
                   (string *)&log);
  bVar4 = testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x1b8,"Truncate(kTestFilename, st.st_size - 2, &err)");
  std::__cxx11::string::~string((string *)&err);
  if (!bVar4) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    std::__cxx11::string::~string((string *)&log);
    return;
  }
  std::__cxx11::string::~string((string *)&log);
  State::State(&state);
  pTVar3 = g_current_test;
  log._0_8_ = log._0_8_ & 0xffffffffffffff00;
  log.file_ = (FILE *)0x0;
  log.file_path_._M_string_length = 0;
  log.file_path_.field_2._M_local_buf[0] = '\0';
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  err._M_string_length = 0;
  log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)paVar2;
  log.file_path_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deps,"DepsLogTest-tempfile",(allocator<char> *)&local_1e0);
  LVar6 = DepsLog::Load(&log,(string *)&deps,&state,&err);
  testing::Test::Check
            (pTVar3,LVar6 != LOAD_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x1c0,"log.Load(kTestFilename, &state, &err)");
  std::__cxx11::string::~string((string *)&deps);
  pTVar3 = g_current_test;
  bVar4 = std::operator==("premature end of file; recovering",&err);
  bVar4 = testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,0x1c1,"\"premature end of file; recovering\" == err");
  if (bVar4) {
    err._M_string_length = 0;
    *err._M_dataplus._M_p = '\0';
    pTVar3 = g_current_test;
    path_05.len_ = 6;
    path_05.str_ = "out2.o";
    pNVar7 = State::GetNode(&state,path_05,0);
    pDVar8 = DepsLog::GetDeps(&log,pNVar7);
    testing::Test::Check
              (pTVar3,pDVar8 == (Deps *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
               ,0x1c5,"NULL == log.GetDeps(state.GetNode(\"out2.o\", 0))");
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&deps,"DepsLogTest-tempfile",(allocator<char> *)&local_1e0);
    bVar4 = DepsLog::OpenForWrite(&log,(string *)&deps,&err);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
               ,0x1c7,"log.OpenForWrite(kTestFilename, &err)");
    std::__cxx11::string::~string((string *)&deps);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&err);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x1c8,"\"\" == err");
    if (bVar4) {
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path_06.len_ = 5;
      path_06.str_ = "foo.h";
      local_1e0 = State::GetNode(&state,path_06,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,&local_1e0);
      path_07.len_ = 6;
      path_07.str_ = "bar2.h";
      local_1e0 = State::GetNode(&state,path_07,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&deps,&local_1e0);
      path_08.len_ = 6;
      path_08.str_ = "out2.o";
      pNVar7 = State::GetNode(&state,path_08,0);
      DepsLog::RecordDeps(&log,pNVar7,3,&deps);
      DepsLog::Close(&log);
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                (&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
      std::__cxx11::string::~string((string *)&err);
      DepsLog::~DepsLog(&log);
      State::~State(&state);
      State::State(&state);
      pTVar3 = g_current_test;
      log._0_8_ = log._0_8_ & 0xffffffffffffff00;
      log.file_ = (FILE *)0x0;
      log.file_path_._M_string_length = 0;
      log.file_path_.field_2._M_local_buf[0] = '\0';
      log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      err._M_string_length = 0;
      log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      err.field_2._M_local_buf[0] = '\0';
      err._M_dataplus._M_p = (pointer)paVar2;
      log.file_path_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&deps,"DepsLogTest-tempfile",(allocator<char> *)&local_1e0);
      LVar6 = DepsLog::Load(&log,(string *)&deps,&state,&err);
      testing::Test::Check
                (pTVar3,LVar6 != LOAD_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                 ,0x1d9,"log.Load(kTestFilename, &state, &err)");
      std::__cxx11::string::~string((string *)&deps);
      path_09.len_ = 6;
      path_09.str_ = "out2.o";
      pNVar7 = State::GetNode(&state,path_09,0);
      pDVar8 = DepsLog::GetDeps(&log,pNVar7);
      bVar4 = testing::Test::Check
                        (g_current_test,pDVar8 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x1dd,"deps");
      if (bVar4) goto LAB_001555df;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001555df:
  std::__cxx11::string::~string((string *)&err);
  DepsLog::~DepsLog(&log);
  State::~State(&state);
  return;
}

Assistant:

TEST_F(DepsLogTest, TruncatedRecovery) {
  // Create a file with some entries.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

    log.Close();
  }

  // Shorten the file, corrupting the last record.
  {
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    string err;
    ASSERT_TRUE(Truncate(kTestFilename, st.st_size - 2, &err));
  }

  // Load the file again, add an entry.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));
    ASSERT_EQ("premature end of file; recovering", err);
    err.clear();

    // The truncated entry should've been discarded.
    EXPECT_EQ(NULL, log.GetDeps(state.GetNode("out2.o", 0)));

    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    // Add a new entry.
    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 3, deps);

    log.Close();
  }

  // Load the file a third time to verify appending after a mangled
  // entry doesn't break things.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));

    // The truncated entry should exist.
    DepsLog::Deps* deps = log.GetDeps(state.GetNode("out2.o", 0));
    ASSERT_TRUE(deps);
  }
}